

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O0

void printMSRMaskOperand(MCInst *MI,uint OpNum,SStream *O)

{
  uint uVar1;
  uint uVar2;
  MCOperand *op;
  ulong uVar3;
  ulong uVar4;
  uint64_t uVar5;
  int64_t iVar6;
  uint in_ESI;
  MCInst *in_RDI;
  uint Opcode;
  uint SYSm;
  uint64_t FeatureBits;
  uint reg;
  uint Mask;
  uint SpecRegRBit;
  MCOperand *Op;
  char *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  arm_sysreg local_2c;
  
  op = MCInst_getOperand(in_RDI,in_ESI);
  uVar3 = MCOperand_getImm(op);
  uVar4 = MCOperand_getImm(op);
  uVar2 = (uint)uVar4;
  uVar1 = uVar2 & 0xf;
  uVar5 = ARM_getFeatureBits(in_RDI->csh->mode);
  if ((uVar5 & 0x4000) == 0) {
    if (((uVar3 >> 4 & 0xfffffff) != 0) || (((uVar1 != 8 && (uVar1 != 4)) && (uVar1 != 0xc)))) {
      local_2c = ARM_SYSREG_INVALID;
      if ((uVar3 >> 4 & 0xfffffff) == 0) {
        SStream_concat0((SStream *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                        in_stack_ffffffffffffff98);
        if ((uVar4 & 0xf) == 0) {
          return;
        }
        SStream_concat0((SStream *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                        in_stack_ffffffffffffff98);
        if ((uVar4 & 8) != 0) {
          SStream_concat0((SStream *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                          in_stack_ffffffffffffff98);
          local_2c = ARM_SYSREG_CPSR_F;
        }
        if ((uVar4 & 4) != 0) {
          SStream_concat0((SStream *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                          in_stack_ffffffffffffff98);
          local_2c = local_2c + ARM_SYSREG_CPSR_S;
        }
        if ((uVar4 & 2) != 0) {
          SStream_concat0((SStream *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                          in_stack_ffffffffffffff98);
          local_2c = local_2c + ARM_SYSREG_CPSR_X;
        }
        if ((uVar4 & 1) != 0) {
          SStream_concat0((SStream *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                          in_stack_ffffffffffffff98);
          local_2c = local_2c + ARM_SYSREG_CPSR_C;
        }
        ARM_addSysReg(in_RDI,local_2c);
        return;
      }
      SStream_concat0((SStream *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff98);
      if ((uVar4 & 0xf) == 0) {
        return;
      }
      SStream_concat0((SStream *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff98);
      if ((uVar4 & 8) != 0) {
        SStream_concat0((SStream *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                        in_stack_ffffffffffffff98);
        local_2c = ARM_SYSREG_SPSR_F;
      }
      if ((uVar4 & 4) != 0) {
        SStream_concat0((SStream *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                        in_stack_ffffffffffffff98);
        local_2c = local_2c + ARM_SYSREG_SPSR_S;
      }
      if ((uVar4 & 2) != 0) {
        SStream_concat0((SStream *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                        in_stack_ffffffffffffff98);
        local_2c = local_2c + ARM_SYSREG_SPSR_X;
      }
      if ((uVar4 & 1) != 0) {
        SStream_concat0((SStream *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                        in_stack_ffffffffffffff98);
        local_2c = local_2c + ARM_SYSREG_SPSR_C;
      }
      ARM_addSysReg(in_RDI,local_2c);
      return;
    }
    SStream_concat0((SStream *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                    in_stack_ffffffffffffff98);
    if (uVar1 != 4) {
      if (uVar1 == 8) {
        SStream_concat0((SStream *)(CONCAT44(uVar2,in_stack_ffffffffffffffa0) & 0xfffffffff),
                        in_stack_ffffffffffffff98);
        ARM_addSysReg(in_RDI,ARM_SYSREG_APSR_NZCVQ);
        return;
      }
      if (uVar1 == 0xc) {
        SStream_concat0((SStream *)(CONCAT44(uVar2,in_stack_ffffffffffffffa0) & 0xfffffffff),
                        in_stack_ffffffffffffff98);
        ARM_addSysReg(in_RDI,ARM_SYSREG_APSR_NZCVQG);
        return;
      }
    }
    SStream_concat0((SStream *)(CONCAT44(uVar2,in_stack_ffffffffffffffa0) & 0xfffffffff),
                    in_stack_ffffffffffffff98);
    ARM_addSysReg(in_RDI,ARM_SYSREG_APSR_G);
    return;
  }
  iVar6 = MCOperand_getImm(op);
  uVar1 = (uint)iVar6;
  uVar2 = MCInst_getOpcode(in_RDI);
  if ((uVar2 == 0x9a5) && ((uVar5 & 0x80) != 0)) {
    if (uVar1 == 0x400) {
      SStream_concat0((SStream *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff98);
      ARM_addSysReg(in_RDI,ARM_SYSREG_APSR_G);
      return;
    }
    if (uVar1 == 0x401) {
      SStream_concat0((SStream *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff98);
      ARM_addSysReg(in_RDI,ARM_SYSREG_IAPSR_G);
      return;
    }
    if (uVar1 == 0x402) {
      SStream_concat0((SStream *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff98);
      ARM_addSysReg(in_RDI,ARM_SYSREG_EAPSR_G);
      return;
    }
    if (uVar1 == 0x403) {
      SStream_concat0((SStream *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff98);
      ARM_addSysReg(in_RDI,ARM_SYSREG_XPSR_G);
      return;
    }
    if (uVar1 == 0xc00) {
      SStream_concat0((SStream *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff98);
      ARM_addSysReg(in_RDI,ARM_SYSREG_APSR_NZCVQG);
      return;
    }
    if (uVar1 == 0xc01) {
      SStream_concat0((SStream *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff98);
      ARM_addSysReg(in_RDI,ARM_SYSREG_IAPSR_NZCVQG);
      return;
    }
    if (uVar1 == 0xc02) {
      SStream_concat0((SStream *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff98);
      ARM_addSysReg(in_RDI,ARM_SYSREG_EAPSR_NZCVQG);
      return;
    }
    if (uVar1 == 0xc03) {
      SStream_concat0((SStream *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff98);
      ARM_addSysReg(in_RDI,ARM_SYSREG_XPSR_NZCVQG);
      return;
    }
  }
  if ((uVar2 == 0x9a5) && ((uVar5 & 0x10000000000) != 0)) {
    switch(uVar1 & 0xff) {
    case 0:
      SStream_concat0((SStream *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff98);
      ARM_addSysReg(in_RDI,ARM_SYSREG_APSR_NZCVQ);
      break;
    case 1:
      SStream_concat0((SStream *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff98);
      ARM_addSysReg(in_RDI,ARM_SYSREG_IAPSR_NZCVQ);
      break;
    case 2:
      SStream_concat0((SStream *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff98);
      ARM_addSysReg(in_RDI,ARM_SYSREG_EAPSR_NZCVQ);
      break;
    case 3:
      SStream_concat0((SStream *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff98);
      ARM_addSysReg(in_RDI,ARM_SYSREG_XPSR_NZCVQ);
      break;
    default:
      goto code_r0x002bd3b6;
    }
  }
  else {
code_r0x002bd3b6:
    switch(uVar1 & 0xff) {
    case 1:
      SStream_concat0((SStream *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff98);
      ARM_addSysReg(in_RDI,ARM_SYSREG_IAPSR);
      break;
    case 2:
      SStream_concat0((SStream *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff98);
      ARM_addSysReg(in_RDI,ARM_SYSREG_EAPSR);
      break;
    case 3:
      SStream_concat0((SStream *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff98);
      ARM_addSysReg(in_RDI,ARM_SYSREG_XPSR);
      break;
    default:
    case 0:
      SStream_concat0((SStream *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff98);
      ARM_addSysReg(in_RDI,ARM_SYSREG_APSR);
      break;
    case 5:
      SStream_concat0((SStream *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff98);
      ARM_addSysReg(in_RDI,ARM_SYSREG_IPSR);
      break;
    case 6:
      SStream_concat0((SStream *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff98);
      ARM_addSysReg(in_RDI,ARM_SYSREG_EPSR);
      break;
    case 7:
      SStream_concat0((SStream *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff98);
      ARM_addSysReg(in_RDI,ARM_SYSREG_IEPSR);
      break;
    case 8:
      SStream_concat0((SStream *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff98);
      ARM_addSysReg(in_RDI,ARM_SYSREG_MSP);
      break;
    case 9:
      SStream_concat0((SStream *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff98);
      ARM_addSysReg(in_RDI,ARM_SYSREG_PSP);
      break;
    case 0x10:
      SStream_concat0((SStream *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff98);
      ARM_addSysReg(in_RDI,ARM_SYSREG_PRIMASK);
      break;
    case 0x11:
      SStream_concat0((SStream *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff98);
      ARM_addSysReg(in_RDI,ARM_SYSREG_BASEPRI);
      break;
    case 0x12:
      SStream_concat0((SStream *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff98);
      ARM_addSysReg(in_RDI,ARM_SYSREG_BASEPRI_MAX);
      break;
    case 0x13:
      SStream_concat0((SStream *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff98);
      ARM_addSysReg(in_RDI,ARM_SYSREG_FAULTMASK);
      break;
    case 0x14:
      SStream_concat0((SStream *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff98);
      ARM_addSysReg(in_RDI,ARM_SYSREG_CONTROL);
    }
  }
  return;
}

Assistant:

static void printMSRMaskOperand(MCInst *MI, unsigned OpNum, SStream *O)
{
	MCOperand *Op = MCInst_getOperand(MI, OpNum);
	unsigned SpecRegRBit = (unsigned)MCOperand_getImm(Op) >> 4;
	unsigned Mask = (unsigned)MCOperand_getImm(Op) & 0xf;
	unsigned reg;
	uint64_t FeatureBits = ARM_getFeatureBits(MI->csh->mode);

	if (FeatureBits & ARM_FeatureMClass) {
		unsigned SYSm = (unsigned)MCOperand_getImm(Op);
		unsigned Opcode = MCInst_getOpcode(MI);

		// For writes, handle extended mask bits if the DSP extension is present.
		if (Opcode == ARM_t2MSR_M && (FeatureBits & ARM_FeatureDSPThumb2)) {
			switch (SYSm) {
				case 0x400: SStream_concat0(O, "apsr_g"); ARM_addSysReg(MI, ARM_SYSREG_APSR_G); return;
				case 0xc00: SStream_concat0(O, "apsr_nzcvqg"); ARM_addSysReg(MI, ARM_SYSREG_APSR_NZCVQG); return;
				case 0x401: SStream_concat0(O, "iapsr_g"); ARM_addSysReg(MI, ARM_SYSREG_IAPSR_G); return;
				case 0xc01: SStream_concat0(O, "iapsr_nzcvqg"); ARM_addSysReg(MI, ARM_SYSREG_IAPSR_NZCVQG); return;
				case 0x402: SStream_concat0(O, "eapsr_g"); ARM_addSysReg(MI, ARM_SYSREG_EAPSR_G); return;
				case 0xc02: SStream_concat0(O, "eapsr_nzcvqg"); ARM_addSysReg(MI, ARM_SYSREG_EAPSR_NZCVQG); return;
				case 0x403: SStream_concat0(O, "xpsr_g"); ARM_addSysReg(MI, ARM_SYSREG_XPSR_G); return;
				case 0xc03: SStream_concat0(O, "xpsr_nzcvqg"); ARM_addSysReg(MI, ARM_SYSREG_XPSR_NZCVQG); return;
			}
		}

		// Handle the basic 8-bit mask.
		SYSm &= 0xff;

		if (Opcode == ARM_t2MSR_M && (FeatureBits & ARM_HasV7Ops)) {
			// ARMv7-M deprecates using MSR APSR without a _<bits> qualifier as an
			// alias for MSR APSR_nzcvq.
			switch (SYSm) {
				case 0: SStream_concat0(O, "apsr_nzcvq"); ARM_addSysReg(MI, ARM_SYSREG_APSR_NZCVQ); return;
				case 1: SStream_concat0(O, "iapsr_nzcvq"); ARM_addSysReg(MI, ARM_SYSREG_IAPSR_NZCVQ); return;
				case 2: SStream_concat0(O, "eapsr_nzcvq"); ARM_addSysReg(MI, ARM_SYSREG_EAPSR_NZCVQ); return;
				case 3: SStream_concat0(O, "xpsr_nzcvq"); ARM_addSysReg(MI, ARM_SYSREG_XPSR_NZCVQ); return;
			}
		}


		switch (SYSm) {
			default: //llvm_unreachable("Unexpected mask value!");
			case  0: SStream_concat0(O, "apsr"); ARM_addSysReg(MI, ARM_SYSREG_APSR); return;
			case  1: SStream_concat0(O, "iapsr"); ARM_addSysReg(MI, ARM_SYSREG_IAPSR); return;
			case  2: SStream_concat0(O, "eapsr"); ARM_addSysReg(MI, ARM_SYSREG_EAPSR); return;
			case  3: SStream_concat0(O, "xpsr"); ARM_addSysReg(MI, ARM_SYSREG_XPSR); return;
			case  5: SStream_concat0(O, "ipsr"); ARM_addSysReg(MI, ARM_SYSREG_IPSR); return;
			case  6: SStream_concat0(O, "epsr"); ARM_addSysReg(MI, ARM_SYSREG_EPSR); return;
			case  7: SStream_concat0(O, "iepsr"); ARM_addSysReg(MI, ARM_SYSREG_IEPSR); return;
			case  8: SStream_concat0(O, "msp"); ARM_addSysReg(MI, ARM_SYSREG_MSP); return;
			case  9: SStream_concat0(O, "psp"); ARM_addSysReg(MI, ARM_SYSREG_PSP); return;
			case 16: SStream_concat0(O, "primask"); ARM_addSysReg(MI, ARM_SYSREG_PRIMASK); return;
			case 17: SStream_concat0(O, "basepri"); ARM_addSysReg(MI, ARM_SYSREG_BASEPRI); return;
			case 18: SStream_concat0(O, "basepri_max"); ARM_addSysReg(MI, ARM_SYSREG_BASEPRI_MAX); return;
			case 19: SStream_concat0(O, "faultmask"); ARM_addSysReg(MI, ARM_SYSREG_FAULTMASK); return;
			case 20: SStream_concat0(O, "control"); ARM_addSysReg(MI, ARM_SYSREG_CONTROL); return;
		}
	}

	// As special cases, CPSR_f, CPSR_s and CPSR_fs prefer printing as
	// APSR_nzcvq, APSR_g and APSRnzcvqg, respectively.
	if (!SpecRegRBit && (Mask == 8 || Mask == 4 || Mask == 12)) {
		SStream_concat0(O, "apsr_");
		switch (Mask) {
			default: // llvm_unreachable("Unexpected mask value!");
			case 4:  SStream_concat0(O, "g"); ARM_addSysReg(MI, ARM_SYSREG_APSR_G); return;
			case 8:  SStream_concat0(O, "nzcvq"); ARM_addSysReg(MI, ARM_SYSREG_APSR_NZCVQ); return;
			case 12: SStream_concat0(O, "nzcvqg"); ARM_addSysReg(MI, ARM_SYSREG_APSR_NZCVQG); return;
		}
	}

	reg = 0;
	if (SpecRegRBit) {
		SStream_concat0(O, "spsr");
		if (Mask) {
			SStream_concat0(O, "_");
			if (Mask & 8) {
				SStream_concat0(O, "f");
				reg += ARM_SYSREG_SPSR_F;
			}

			if (Mask & 4) {
				SStream_concat0(O, "s");
				reg += ARM_SYSREG_SPSR_S;
			}

			if (Mask & 2) {
				SStream_concat0(O, "x");
				reg += ARM_SYSREG_SPSR_X;
			}

			if (Mask & 1) {
				SStream_concat0(O, "c");
				reg += ARM_SYSREG_SPSR_C;
			}
			ARM_addSysReg(MI, reg);
		}
	} else {
		SStream_concat0(O, "cpsr");
		if (Mask) {
			SStream_concat0(O, "_");
			if (Mask & 8) {
				SStream_concat0(O, "f");
				reg += ARM_SYSREG_CPSR_F;
			}

			if (Mask & 4) {
				SStream_concat0(O, "s");
				reg += ARM_SYSREG_CPSR_S;
			}

			if (Mask & 2) {
				SStream_concat0(O, "x");
				reg += ARM_SYSREG_CPSR_X;
			}

			if (Mask & 1) {
				SStream_concat0(O, "c");
				reg += ARM_SYSREG_CPSR_C;
			}
			ARM_addSysReg(MI, reg);
		}
	}
}